

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O0

defyx_dataset * defyx_alloc_dataset(defyx_flags flags)

{
  defyx_dataset *this;
  uint8_t *puVar1;
  uint in_EDI;
  exception *ex;
  defyx_dataset *dataset;
  size_t in_stack_ffffffffffffffc0;
  
  this = (defyx_dataset *)operator_new(0x10);
  memset(this,0,0x10);
  defyx_dataset::defyx_dataset(this);
  if ((in_EDI & 1) == 0) {
    this->dealloc = defyx::deallocDataset<defyx::AlignedAllocator<64ul>>;
    puVar1 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(in_stack_ffffffffffffffc0);
    this->memory = puVar1;
  }
  else {
    this->dealloc = defyx::deallocDataset<defyx::LargePageAllocator>;
    puVar1 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x124074);
    this->memory = puVar1;
  }
  return this;
}

Assistant:

defyx_dataset *defyx_alloc_dataset(defyx_flags flags) {

		//fail on 32-bit systems if DatasetSize is >= 4 GiB
		if (defyx::DatasetSize > std::numeric_limits<size_t>::max()) {
			return nullptr;
		}

		defyx_dataset *dataset;

		try {
			dataset = new defyx_dataset();
			if (flags & RANDOMX_FLAG_LARGE_PAGES) {
				dataset->dealloc = &defyx::deallocDataset<defyx::LargePageAllocator>;
				dataset->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::DatasetSize);
			}
			else {
				dataset->dealloc = &defyx::deallocDataset<defyx::DefaultAllocator>;
				dataset->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::DatasetSize);
			}
		}
		catch (std::exception &ex) {
			if (dataset != nullptr) {
				defyx_release_dataset(dataset);
				dataset = nullptr;
			}
		}

		return dataset;
	}